

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_sampler_cube
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  DataType DVar2;
  undefined8 in_R9;
  long lVar3;
  DataType in_stack_fffffffffffffe18;
  allocator<char> local_1d9;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"textureGrad - samplerCube",(allocator<char> *)&local_1b0);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
    shaderType = *(ShaderType *)((long)&(anonymous_namespace)::s_shaders + lVar3);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    DVar2 = (DataType)in_R9;
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,__s,&local_1d9);
      std::operator+(&shaderSource,"Verify shader: ",&local_1b0);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_1b0);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x29,TYPE_FLOAT,DVar2);
      std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x29,TYPE_FLOAT_VEC3,TYPE_FLOAT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_190,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&shaderSource);
      DVar2 = TYPE_INT;
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x29,TYPE_FLOAT,TYPE_INT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x36,TYPE_FLOAT,DVar2);
      std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x36,TYPE_FLOAT_VEC3,TYPE_FLOAT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&shaderSource);
      DVar2 = TYPE_INT;
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x36,TYPE_FLOAT,TYPE_INT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3d,TYPE_FLOAT,DVar2);
      std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3d,TYPE_FLOAT_VEC3,TYPE_FLOAT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&shaderSource);
      DVar2 = TYPE_INT;
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3d,TYPE_FLOAT,TYPE_INT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x40,TYPE_FLOAT_VEC3,DVar2);
      std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&shaderSource);
      in_R9 = 0x1b;
      (anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x40,TYPE_FLOAT_VEC3,TYPE_INT,in_stack_fffffffffffffe18);
      std::__cxx11::string::string((string *)&local_170,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_sampler_cube (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGrad - samplerCube");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}